

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O3

void Qentem::Digit::formatStringNumberDefault<Qentem::StringStream<char16_t>>
               (StringStream<char16_t> *stream,SizeT started_at,SizeT32 precision,
               SizeT32 calculated_digits,SizeT32 fraction_length,bool is_positive_exp,bool round_up)

{
  char16_t cVar1;
  char16_t cVar2;
  SizeT SVar3;
  char16_t *pcVar4;
  char16_t *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  char16_t *pcVar10;
  ulong uVar11;
  uint uVar12;
  SizeT SVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  bool power_increased;
  bool local_3d;
  uint local_3c;
  SizeT local_38;
  uint local_34;
  
  uVar15 = stream->length_;
  uVar11 = (ulong)uVar15;
  pcVar4 = stream->storage_;
  local_3d = false;
  uVar16 = uVar15 - started_at;
  local_3c = started_at;
  if (precision < uVar16) {
    local_3c = uVar15 + ~precision;
    local_38 = started_at;
    local_34 = calculated_digits;
    roundStringNumber<Qentem::StringStream<char16_t>>(stream,&local_3c,&local_3d,round_up);
    started_at = local_38;
    calculated_digits = local_34;
    if (!is_positive_exp) {
      uVar11 = (ulong)stream->length_;
      goto LAB_00127694;
    }
    uVar15 = stream->length_;
    uVar11 = (ulong)uVar15;
    iVar9 = 1;
    if (precision <= local_34 && local_34 - precision != 0) {
      iVar9 = local_34 - precision;
    }
    uVar12 = ((local_3d | 0xfffffffe) - fraction_length) + iVar9 + uVar16;
    if (uVar12 < precision) goto LAB_00127694;
    if (uVar15 != 0) {
      pcVar4 = pcVar4 + local_3c;
      for (; (pcVar4 < stream->storage_ + (uVar15 - 1) && (*pcVar4 == L'0')); pcVar4 = pcVar4 + 1) {
        local_3c = local_3c + 1;
      }
    }
  }
  else {
LAB_00127694:
    uVar15 = (uint)uVar11;
    uVar12 = 0;
    if (fraction_length != 0) {
      uVar8 = (ulong)local_3c;
      pcVar5 = stream->storage_;
      if (uVar15 != 0) {
        for (pcVar10 = pcVar4 + uVar8; (pcVar10 < pcVar5 + (uVar15 - 1) && (*pcVar10 == L'0'));
            pcVar10 = pcVar10 + 1) {
          local_3c = (int)uVar8 + 1;
          uVar8 = (ulong)local_3c;
        }
      }
      iVar9 = uVar16 - fraction_length;
      if (uVar16 < fraction_length || iVar9 == 0) {
        uVar12 = fraction_length - uVar16;
        if (fraction_length < uVar16) {
          uVar12 = 0;
        }
        if (local_3d == false) {
          if (uVar12 < 4) {
            uVar15 = uVar15 + uVar12;
            if (stream->capacity_ < uVar15) {
              StringStream<char16_t>::expand(stream,uVar15);
              uVar11 = (ulong)stream->length_;
              pcVar5 = stream->storage_;
            }
            Memory::Copy<unsigned_int>(pcVar5 + uVar11,L"0000000000000000000",uVar12 * 2);
            stream->length_ = uVar15;
            SVar13 = uVar15 + 1;
            SVar3 = stream->capacity_;
            uVar16 = uVar15;
            if (SVar3 == uVar15) {
              StringStream<char16_t>::expand(stream,SVar13);
              uVar16 = stream->length_;
              SVar3 = stream->capacity_;
            }
            pcVar4 = stream->storage_;
            uVar15 = uVar15 + 2;
            uVar8 = (ulong)uVar15;
            pcVar4[uVar16] = L'.';
            stream->length_ = SVar13;
            if (SVar3 == SVar13) {
              StringStream<char16_t>::expand(stream,uVar15);
              SVar13 = stream->length_;
              pcVar4 = stream->storage_;
            }
            pcVar4[SVar13] = L'0';
            stream->length_ = uVar15;
            uVar12 = 0;
            goto LAB_0012794f;
          }
          uVar12 = uVar12 + 1;
        }
        else if (uVar12 < 5 && uVar16 < fraction_length) {
          uVar14 = (uVar15 - 1) + uVar12;
          uVar16 = uVar15;
          local_38 = started_at;
          if (stream->capacity_ < uVar14) {
            StringStream<char16_t>::expand(stream,uVar14);
            uVar16 = stream->length_;
            pcVar5 = stream->storage_;
          }
          Memory::Copy<unsigned_int>(pcVar5 + uVar16,L"0000000000000000000",(uVar12 - 1) * 2);
          stream->length_ = uVar14;
          SVar13 = uVar15 + uVar12;
          uVar15 = stream->capacity_;
          if (uVar15 == uVar14) {
            StringStream<char16_t>::expand(stream,SVar13);
            uVar14 = stream->length_;
            uVar15 = stream->capacity_;
          }
          pcVar4 = stream->storage_;
          uVar16 = SVar13 + 1;
          uVar8 = (ulong)uVar16;
          pcVar4[uVar14] = L'.';
          stream->length_ = SVar13;
          if (uVar15 == SVar13) {
            StringStream<char16_t>::expand(stream,uVar16);
            SVar13 = stream->length_;
            pcVar4 = stream->storage_;
          }
          pcVar4[SVar13] = L'0';
          stream->length_ = uVar16;
          uVar12 = 0;
          started_at = local_38;
          goto LAB_0012794f;
        }
      }
      else {
        uVar14 = fraction_length + started_at;
        if ((uint)uVar8 < uVar14) {
          if (uVar14 < uVar15) {
            pcVar4 = pcVar5 + (ulong)uVar14 + 1;
            cVar1 = pcVar4[-1];
            pcVar4[-1] = L'.';
            for (; pcVar4 < pcVar5 + uVar11; pcVar4 = pcVar4 + 1) {
              cVar2 = *pcVar4;
              *pcVar4 = cVar1;
              cVar1 = cVar2;
            }
            uVar16 = uVar15 + 1;
            uVar8 = (ulong)uVar16;
            if (stream->capacity_ == uVar15) {
              StringStream<char16_t>::expand(stream,uVar16);
              uVar11 = (ulong)stream->length_;
              pcVar5 = stream->storage_;
            }
            uVar12 = 0;
            pcVar5[uVar11] = cVar1;
            stream->length_ = uVar16;
            goto LAB_0012794f;
          }
        }
        else {
          if ((local_3d != true) &&
             (uVar12 = (uint)uVar8 - started_at, iVar9 = uVar12 - (uVar16 - calculated_digits),
             uVar12 < uVar16 - calculated_digits)) {
            iVar9 = 0;
          }
          for (; uVar12 = 0, iVar9 != 0; iVar9 = iVar9 + -1) {
            local_3c = (int)uVar8 - 1;
            uVar8 = (ulong)local_3c;
            pcVar4[uVar8] = L'0';
          }
        }
      }
    }
  }
  uVar8 = (ulong)uVar15;
LAB_0012794f:
  uVar15 = (uint)uVar8;
  if (started_at < uVar15) {
    pcVar4 = stream->storage_;
    uVar11 = uVar8;
    uVar7 = (ulong)started_at;
    do {
      uVar6 = uVar7 + 1;
      cVar1 = pcVar4[uVar7];
      pcVar4[uVar7] = pcVar4[uVar11 - 1];
      pcVar4[uVar11 - 1] = cVar1;
      uVar11 = uVar11 - 1;
      uVar7 = uVar6;
    } while (uVar6 < uVar11);
  }
  uVar16 = uVar15 - (local_3c - started_at);
  if (local_3c - started_at <= uVar15) {
    uVar8 = (ulong)uVar16;
    stream->length_ = uVar16;
  }
  if (uVar12 != 0) {
    uVar15 = (uint)uVar8;
    if (started_at + 1 < uVar15) {
      pcVar5 = stream->storage_;
      pcVar4 = pcVar5 + (ulong)(started_at + 1) + 1;
      cVar1 = pcVar4[-1];
      pcVar4[-1] = L'.';
      for (; pcVar4 < pcVar5 + uVar8; pcVar4 = pcVar4 + 1) {
        cVar2 = *pcVar4;
        *pcVar4 = cVar1;
        cVar1 = cVar2;
      }
      if (stream->capacity_ == uVar15) {
        StringStream<char16_t>::expand(stream,uVar15 + 1);
        uVar8 = (ulong)stream->length_;
        pcVar5 = stream->storage_;
      }
      pcVar5[uVar8] = cVar1;
      stream->length_ = uVar15 + 1;
    }
    insertPowerOfTen<Qentem::StringStream<char16_t>>(stream,uVar12,is_positive_exp);
  }
  return;
}

Assistant:

static void formatStringNumberDefault(Stream_T &stream, const SizeT started_at, const SizeT32 precision,
                                          const SizeT32 calculated_digits, SizeT32 fraction_length,
                                          const bool is_positive_exp, const bool round_up) {
        using Char_T                = typename Stream_T::CharType;
        Char_T     *storage         = stream.Storage();
        const SizeT number_length   = (stream.Length() - started_at);
        SizeT       index           = started_at;
        SizeT       power           = 0;
        bool        power_increased = false;
        /////////////////////////////////////////////////////
        if (number_length > precision) {
            --index;
            index += SizeT(number_length - precision);

            roundStringNumber(stream, index, power_increased, round_up);

            if (is_positive_exp) {
                const SizeT diff =
                    SizeT(((number_length - fraction_length) +
                           ((calculated_digits <= precision) ? 0 : (calculated_digits - (precision + SizeT{1})))) -
                          SizeT(!power_increased));

                if (diff >= precision) {
                    Char_T       *number = (storage + index);
                    const Char_T *last   = stream.Last();

                    while ((number < last) && (*number == DigitUtils::DigitChar::Zero)) {
                        ++number;
                        ++index;
                    }

                    power           = diff;
                    fraction_length = 0;
                }
            }
        }

        if (fraction_length != 0) {
            Char_T       *number        = (storage + index);
            const Char_T *last          = stream.Last();
            const SizeT   dot_index     = SizeT(started_at + fraction_length);
            const bool    fraction_only = (number_length <= fraction_length);

            while ((number < last) && (*number == DigitUtils::DigitChar::Zero)) {
                ++number;
                ++index;
            }

            if (fraction_only) {
                const SizeT diff = SizeT((fraction_length > number_length) ? (fraction_length - number_length) : 0);

                if (!power_increased) {
                    if (diff < SizeT{4}) {
                        insertZeros(stream, diff);
                        stream += DigitUtils::DigitChar::Dot;
                        stream += DigitUtils::DigitChar::Zero;
                    } else {
                        power = diff;
                        ++power;
                    }
                } else if ((diff != 0) && (diff < SizeT{5})) {
                    insertZeros(stream, (diff - SizeT{1}));
                    stream += DigitUtils::DigitChar::Dot;
                    stream += DigitUtils::DigitChar::Zero;
                } else {
                    power = diff;
                }
            } else if (index < dot_index) {
                stream.InsertAt(DigitUtils::DigitChar::Dot, dot_index);
            } else {
                SizeT zeros = 0;

                if (power_increased) {
                    zeros = SizeT(number_length - fraction_length);
                } else {
                    const SizeT rem    = (index - started_at);
                    const SizeT needed = SizeT(number_length - calculated_digits);

                    if (rem > needed) {
                        zeros = (rem - needed);
                    }
                }

                while (zeros != 0) {
                    --index;
                    storage[index] = DigitUtils::DigitChar::Zero;
                    --zeros;
                }
            }
        }

        stream.Reverse(started_at);
        stream.StepBack(index - started_at);

        if (power != 0) {
            stream.InsertAt(DigitUtils::DigitChar::Dot, (started_at + SizeT{1}));
            insertPowerOfTen(stream, power, is_positive_exp);
        }
    }